

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O2

int __thiscall LPCMStreamReader::decodeWaveHeader(LPCMStreamReader *this,uint8_t *buff,uint8_t *end)

{
  LPCMHeaderType LVar1;
  uint uVar2;
  bool bVar3;
  ushort uVar4;
  ushort *puVar5;
  uint8_t *puVar6;
  undefined4 *puVar7;
  ostream *poVar8;
  byte bVar9;
  int iVar10;
  bool *pbVar11;
  uint8_t *puVar12;
  char *pcVar13;
  ulong uVar14;
  ushort *puVar15;
  uint *local_268;
  undefined8 local_260;
  uint local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  uint *local_248;
  undefined8 local_240;
  uint local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  uint *local_228;
  undefined8 local_220;
  uint local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  uint *local_208;
  undefined8 local_200;
  uint local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream ss;
  
  if ((long)end - (long)buff < 0x14) {
    return -10;
  }
  LVar1 = this->m_headerType;
  puVar5 = (ushort *)findSubstr(anon_var_dwarf_de63a + 0xc,buff,end);
  if (LVar1 == htWAVE64) {
    if (puVar5 == (ushort *)0x0) {
      return -10;
    }
    if (end <= puVar5 + 0xc) {
      return -10;
    }
    uVar14 = *(ulong *)(puVar5 + 8);
    puVar6 = (uint8_t *)((long)puVar5 + uVar14);
    puVar15 = puVar5;
    puVar5 = puVar5 + 0xc;
  }
  else {
    if (puVar5 == (ushort *)0x0) {
      return -10;
    }
    puVar15 = puVar5 + 4;
    if (end <= puVar15) {
      return -10;
    }
    uVar14 = (ulong)*(uint *)(puVar5 + 2);
    puVar6 = (uint8_t *)(uVar14 + (long)puVar15);
    puVar5 = puVar15;
  }
  if (end <= puVar6) {
    return -10;
  }
  uVar4 = puVar5[1];
  bVar9 = (byte)uVar4;
  this->m_channels = bVar9;
  uVar4 = uVar4 & 0xff;
  if (8 < uVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar8 = std::operator<<((ostream *)&ss,"Too many channels: ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)this->m_channels);
    std::operator<<(poVar8,". Maximum supported value is 8(7.1)");
    puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar7 = 3;
    *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
    if (local_1c8 == &local_1b8) {
      puVar7[6] = local_1b8;
      puVar7[7] = uStack_1b4;
      puVar7[8] = uStack_1b0;
      puVar7[9] = uStack_1ac;
    }
    else {
      *(uint **)(puVar7 + 2) = local_1c8;
      *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1b4,local_1b8);
    }
    *(undefined8 *)(puVar7 + 4) = local_1c0;
    local_1c0 = 0;
    local_1b8 = local_1b8 & 0xffffff00;
    local_1c8 = &local_1b8;
    __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  if (uVar4 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    std::operator<<((ostream *)&ss,"Invalid channels count: 0. WAVE header is invalid.");
    puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar7 = 3;
    *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
    if (local_1e8 == &local_1d8) {
      puVar7[6] = local_1d8;
      puVar7[7] = uStack_1d4;
      puVar7[8] = uStack_1d0;
      puVar7[9] = uStack_1cc;
    }
    else {
      *(uint **)(puVar7 + 2) = local_1e8;
      *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1d4,local_1d8);
    }
    *(undefined8 *)(puVar7 + 4) = local_1e0;
    local_1e0 = 0;
    local_1d8 = local_1d8 & 0xffffff00;
    local_1e8 = &local_1d8;
    __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  iVar10 = *(int *)(puVar5 + 2);
  this->m_freq = iVar10;
  if (((iVar10 != 48000) && (iVar10 != 96000)) && (iVar10 != 0x2ee00)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar8 = std::operator<<((ostream *)&ss,"Sample rate ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_freq);
    std::operator<<(poVar8," is not supported for LPCM format. Allowed values: 48000, 96000, 192000"
                   );
    puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar7 = 3;
    *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
    if (local_208 == &local_1f8) {
      puVar7[6] = local_1f8;
      puVar7[7] = uStack_1f4;
      puVar7[8] = uStack_1f0;
      puVar7[9] = uStack_1ec;
    }
    else {
      *(uint **)(puVar7 + 2) = local_208;
      *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1f4,local_1f8);
    }
    *(undefined8 *)(puVar7 + 4) = local_200;
    local_200 = 0;
    local_1f8 = local_1f8 & 0xffffff00;
    local_208 = &local_1f8;
    __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  uVar4 = puVar5[7];
  this->m_bitsPerSample = uVar4;
  if ((0x18 < uVar4) || ((0x1110000U >> (uVar4 & 0x1f) & 1) == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar8 = std::operator<<((ostream *)&ss,"Bit depth ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_bitsPerSample);
    std::operator<<(poVar8," is not supported for LPCM format. Allowed values: 16bit, 20bit, 24bit")
    ;
    puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar7 = 3;
    *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
    if (local_228 == &local_218) {
      puVar7[6] = local_218;
      puVar7[7] = uStack_214;
      puVar7[8] = uStack_210;
      puVar7[9] = uStack_20c;
    }
    else {
      *(uint **)(puVar7 + 2) = local_228;
      *(ulong *)(puVar7 + 6) = CONCAT44(uStack_214,local_218);
    }
    *(undefined8 *)(puVar7 + 4) = local_220;
    local_220 = 0;
    local_218 = local_218 & 0xffffff00;
    local_228 = &local_218;
    __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  pbVar11 = &this->m_lfeExists;
  this->m_lfeExists = false;
  if (*puVar5 != 1) {
    if (*puVar5 != 0xfffe) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      poVar8 = std::operator<<((ostream *)&ss,"Unsupported WAVE format. wFormatTag: ");
      std::ostream::operator<<(poVar8,*puVar5);
      puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar7 = 3;
      *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
      if (local_268 == &local_258) {
        puVar7[6] = local_258;
        puVar7[7] = uStack_254;
        puVar7[8] = uStack_250;
        puVar7[9] = uStack_24c;
      }
      else {
        *(uint **)(puVar7 + 2) = local_268;
        *(ulong *)(puVar7 + 6) = CONCAT44(uStack_254,local_258);
      }
      *(undefined8 *)(puVar7 + 4) = local_260;
      local_258 = local_258 & 0xffffff00;
      __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    if (puVar5[9] != 0) {
      this->m_bitsPerSample = puVar5[9];
    }
    *pbVar11 = (bool)((byte)puVar5[10] >> 3 & 1);
    bVar3 = wave_format::GUID::operator==
                      ((GUID *)(puVar5 + 0xc),(GUID *)wave_format::KSDATAFORMAT_SUBTYPE_PCM);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      std::operator<<((ostream *)&ss,"Unsupported WAVE format. Only PCM audio is supported.");
      puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar7 = 3;
      *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
      if (local_248 == &local_238) {
        puVar7[6] = local_238;
        puVar7[7] = uStack_234;
        puVar7[8] = uStack_230;
        puVar7[9] = uStack_22c;
      }
      else {
        *(uint **)(puVar7 + 2) = local_248;
        *(ulong *)(puVar7 + 6) = CONCAT44(uStack_234,local_238);
      }
      *(undefined8 *)(puVar7 + 4) = local_240;
      local_240 = 0;
      local_238 = local_238 & 0xffffff00;
      local_248 = &local_238;
      __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    goto switchD_001a5655_default;
  }
  if (bVar9 < 3) goto switchD_001a5655_default;
  switch(bVar9) {
  case 3:
    poVar8 = std::operator<<((ostream *)&std::cerr,"Warning! Multi channels WAVE file for stream ");
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                               m_streamIndex);
    pcVar13 = " do not contain channels configuration info. Applying default value: L R LFE";
    break;
  case 4:
    poVar8 = std::operator<<((ostream *)&std::cerr,"Warning! Multi channels WAVE file for stream ");
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                               m_streamIndex);
    pcVar13 = " do not contain channels configuration info. Applying default value: L R BL BR";
    goto LAB_001a5725;
  case 5:
    poVar8 = std::operator<<((ostream *)&std::cerr,"Warning! Multi channels WAVE file for stream ");
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                               m_streamIndex);
    pcVar13 = " do not contain channels configuration info. Applying default value: L R C BL BR";
    goto LAB_001a5725;
  case 6:
    poVar8 = std::operator<<((ostream *)&std::cerr,"Warning! Multi channels WAVE file for stream ");
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                               m_streamIndex);
    pcVar13 = " do not contain channels configuration info. Applying default value: L R C LFE BL BR"
    ;
    break;
  case 7:
    poVar8 = std::operator<<((ostream *)&std::cerr,"Warning! Multi channels WAVE file for stream ");
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                               m_streamIndex);
    pcVar13 = 
    " do not contain channels configuration info. Applying default value: L R C BL BR SL SR";
LAB_001a5725:
    poVar8 = std::operator<<(poVar8,pcVar13);
    std::endl<char,std::char_traits<char>>(poVar8);
    pbVar11 = &sLastMsg;
    goto LAB_001a5787;
  case 8:
    poVar8 = std::operator<<((ostream *)&std::cerr,"Warning! Multi channels WAVE file for stream ");
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                               m_streamIndex);
    pcVar13 = 
    " do not contain channels configuration info. Applying default value: L R C LFE BL BR SL SR";
    break;
  default:
    goto switchD_001a5655_default;
  }
  poVar8 = std::operator<<(poVar8,pcVar13);
  std::endl<char,std::char_traits<char>>(poVar8);
  sLastMsg = true;
LAB_001a5787:
  *pbVar11 = true;
switchD_001a5655_default:
  puVar6 = (uint8_t *)((long)puVar15 + uVar14);
  if (((*(char *)((long)puVar15 + uVar14) == 'F') && (puVar6[1] == 'L')) &&
     ((puVar6[2] == 'L' && (puVar6[3] == 'R')))) {
    if ((long)end - (long)(puVar6 + 8) < *(long *)(puVar6 + 4)) {
      return -10;
    }
    puVar6 = puVar6 + *(long *)(puVar6 + 4) + 8;
  }
  puVar12 = puVar6 + 0xc0;
  if (end < puVar6 + 0xc0) {
    puVar12 = end;
  }
  puVar6 = findSubstr("data",puVar6,puVar12);
  if (puVar6 == (uint8_t *)0x0) {
    iVar10 = -10;
    if ((uint8_t *)0xbf < end) {
      iVar10 = 0;
    }
  }
  else {
    if (this->m_headerType == htWAVE) {
      puVar12 = puVar6 + 8;
      if (end <= puVar12) {
        return -10;
      }
      uVar2 = *(uint *)(puVar6 + 4);
      this->m_curChunkLen = (ulong)uVar2;
      if ((ulong)uVar2 == 0) {
        this->m_openSizeWaveFormat = true;
      }
    }
    else {
      puVar12 = puVar6 + 0x18;
      if (end <= puVar12) {
        return -10;
      }
      this->m_curChunkLen = *(long *)(puVar6 + 0x10) + -0x18;
    }
    iVar10 = (int)puVar12 - (int)buff;
  }
  return iVar10;
}

Assistant:

int LPCMStreamReader::decodeWaveHeader(uint8_t* buff, uint8_t* end)
{
    if (end - buff < 20)
        return NOT_ENOUGH_BUFFER;
    uint8_t* curPos = buff;
    // if (m_channels == 0)
    {
        WAVEFORMATPCMEX* waveFormatPCMEx;
        uint64_t fmtSize;
        if (m_headerType == LPCMHeaderType::htWAVE64)
        {
            curPos = findSubstr("fmt ", buff, end);
            if (curPos == nullptr || curPos + sizeof(GUID) + 8 >= end)
                return NOT_ENOUGH_BUFFER;
            uint8_t* tmpPos = curPos + sizeof(GUID);
            fmtSize = *reinterpret_cast<uint64_t*>(tmpPos);
            if (curPos + fmtSize >= end)
                return NOT_ENOUGH_BUFFER;
            waveFormatPCMEx = reinterpret_cast<WAVEFORMATPCMEX*>(tmpPos + 8);
        }
        else
        {
            curPos = findSubstr("fmt ", buff, end);
            if (curPos == nullptr || curPos + 8 >= end)
                return NOT_ENOUGH_BUFFER;
            fmtSize = *reinterpret_cast<uint32_t*>(curPos + 4);
            if (curPos + 8 + fmtSize >= end)
                return NOT_ENOUGH_BUFFER;
            curPos += 8;
            waveFormatPCMEx = reinterpret_cast<WAVEFORMATPCMEX*>(curPos);
        }

        m_channels = static_cast<uint8_t>(waveFormatPCMEx->nChannels);
        if (m_channels > 8)
            THROW(ERR_COMMON,
                  "Too many channels: " << static_cast<int>(m_channels) << ". Maximum supported value is 8(7.1)")
        if (m_channels == 0)
            THROW(ERR_COMMON, "Invalid channels count: 0. WAVE header is invalid.")
        m_freq = waveFormatPCMEx->nSamplesPerSec;
        if (m_freq != 48000 && m_freq != 96000 && m_freq != 192000)
            THROW(ERR_COMMON,
                  "Sample rate " << m_freq << " is not supported for LPCM format. Allowed values: 48000, 96000, 192000")
        m_bitsPerSample = waveFormatPCMEx->wBitsPerSample;
        if (m_bitsPerSample != 16 && m_bitsPerSample != 20 && m_bitsPerSample != 24)
            THROW(ERR_COMMON, "Bit depth " << m_bitsPerSample
                                           << " is not supported for LPCM format. Allowed values: 16bit, 20bit, 24bit")
        m_lfeExists = false;
        if (waveFormatPCMEx->wFormatTag == WAVE_FORMAT_EXTENSIBLE)
        {
            if (waveFormatPCMEx->Samples.wValidBitsPerSample)
                m_bitsPerSample = waveFormatPCMEx->Samples.wValidBitsPerSample;
            m_lfeExists = waveFormatPCMEx->dwChannelMask & SPEAKER_LOW_FREQUENCY;
            if (!(waveFormatPCMEx->SubFormat == KSDATAFORMAT_SUBTYPE_PCM))
                THROW(ERR_COMMON, "Unsupported WAVE format. Only PCM audio is supported.")
        }
        else if (waveFormatPCMEx->wFormatTag == 0x01)
        {  // standard format
            if (m_channels > 2)
            {
                if (m_channels == 3)
                {
                    LTRACE(LT_WARN, 2,
                           "Warning! Multi channels WAVE file for stream "
                               << m_streamIndex
                               << " do not contain channels configuration info. Applying default value: L R LFE");
                    m_lfeExists = true;
                }
                else if (m_channels == 4)
                {
                    LTRACE(LT_WARN, 2,
                           "Warning! Multi channels WAVE file for stream "
                               << m_streamIndex
                               << " do not contain channels configuration info. Applying default value: L R BL BR");
                }
                else if (m_channels == 5)
                {
                    LTRACE(LT_WARN, 2,
                           "Warning! Multi channels WAVE file for stream "
                               << m_streamIndex
                               << " do not contain channels configuration info. Applying default value: L R C BL BR");
                }
                else if (m_channels == 6)
                {
                    LTRACE(
                        LT_WARN, 2,
                        "Warning! Multi channels WAVE file for stream "
                            << m_streamIndex
                            << " do not contain channels configuration info. Applying default value: L R C LFE BL BR");
                    m_lfeExists = true;
                }
                else if (m_channels == 7)
                {
                    LTRACE(LT_WARN, 2,
                           "Warning! Multi channels WAVE file for stream "
                               << m_streamIndex
                               << " do not contain channels configuration info. Applying default value: L R C BL BR SL "
                                  "SR");
                }
                else if (m_channels == 8)
                {
                    LTRACE(LT_WARN, 2,
                           "Warning! Multi channels WAVE file for stream "
                               << m_streamIndex
                               << " do not contain channels configuration info. Applying default value: L R C LFE BL "
                                  "BR SL SR");
                    m_lfeExists = true;
                }
            }
        }
        else
            THROW(ERR_COMMON, "Unsupported WAVE format. wFormatTag: " << waveFormatPCMEx->wFormatTag)
        curPos += fmtSize;
    }

    // in case there is a 'FLLR' (IPhone filler), skip it
    if (curPos[0] == 'F' && curPos[1] == 'L' && curPos[2] == 'L' && curPos[3] == 'R')
    {
        curPos += 4;
        int64_t fllrSize = *reinterpret_cast<int64_t*>(curPos);
        curPos += 4;
        if (end - curPos < fllrSize)
            return NOT_ENOUGH_BUFFER;
        curPos += fllrSize;
    }

    curPos = findSubstr("data", curPos, FFMIN(curPos + MAX_HEADER_SIZE, end));
    if (curPos == nullptr)
    {
        return end < curPos + MAX_HEADER_SIZE ? NOT_ENOUGH_BUFFER : 0;
        // 'riff' header was wrong detected, it is just data
    }

    if (m_headerType == LPCMHeaderType::htWAVE)
    {
        if (curPos + 8 >= end)
            return NOT_ENOUGH_BUFFER;
        curPos += 4;  // skip 'data' identifier
        m_curChunkLen = *reinterpret_cast<uint32_t*>(curPos);
        if (m_curChunkLen == 0)
            m_openSizeWaveFormat = true;
        curPos += 4;
    }
    else
    {
        if (curPos + sizeof(GUID) + 8 >= end)
            return NOT_ENOUGH_BUFFER;
        curPos += sizeof(GUID);
        // For w64, data length includes data metadata (16 bytes) and size (8 bytes)
        m_curChunkLen = *reinterpret_cast<int64_t*>(curPos) - 24;
        curPos += 8;
    }
    return static_cast<int>(curPos - buff);
}